

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O2

size_t utf8_check_full(char *buffer,size_t size,int32_t *codepoint)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0x1f;
  if (size != 2) {
    if (size == 3) {
      uVar2 = 0xf;
    }
    else {
      if (size != 4) {
        return 0;
      }
      uVar2 = 7;
    }
  }
  uVar2 = (byte)*buffer & uVar2;
  for (uVar3 = 1; uVar3 < size; uVar3 = uVar3 + 1) {
    if (-0x41 < buffer[uVar3]) {
      return 0;
    }
    uVar2 = uVar2 << 6 | (byte)buffer[uVar3] & 0x3f;
  }
  sVar1 = 0;
  if (((size != 2 || 0x7f < (int)uVar2) && ((int)uVar2 < 0x110000)) &&
     (sVar1 = 0, (uVar2 & 0xfffff800) != 0xd800)) {
    if (((size == 3) && ((int)uVar2 < 0x800)) || ((size == 4 && ((int)uVar2 < 0x10000)))) {
      return 0;
    }
    sVar1 = 1;
    if (codepoint != (int32_t *)0x0) {
      *codepoint = uVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t utf8_check_full(const char *buffer, size_t size, int32_t *codepoint)
{
    size_t i;
    int32_t value = 0;
    unsigned char u = (unsigned char)buffer[0];

    if(size == 2)
    {
        value = u & 0x1F;
    }
    else if(size == 3)
    {
        value = u & 0xF;
    }
    else if(size == 4)
    {
        value = u & 0x7;
    }
    else
        return 0;

    for(i = 1; i < size; i++)
    {
        u = (unsigned char)buffer[i];

        if(u < 0x80 || u > 0xBF) {
            /* not a continuation byte */
            return 0;
        }

        value = (value << 6) + (u & 0x3F);
    }

    if(value > 0x10FFFF) {
        /* not in Unicode range */
        return 0;
    }

    else if(0xD800 <= value && value <= 0xDFFF) {
        /* invalid code point (UTF-16 surrogate halves) */
        return 0;
    }

    else if((size == 2 && value < 0x80) ||
            (size == 3 && value < 0x800) ||
            (size == 4 && value < 0x10000)) {
        /* overlong encoding */
        return 0;
    }

    if(codepoint)
        *codepoint = value;

    return 1;
}